

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O3

string * __thiscall
google::protobuf::internal::WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::
MakeInvalidEmbeddedMessage_abi_cxx11_
          (string *__return_storage_ptr__,
          WireFormatInvalidInputTest<proto2_unittest::TestAllTypes> *this,char *bytes,int size)

{
  uint8_t *puVar1;
  int field_number;
  long *plVar2;
  EpsCopyOutputStream *pEVar3;
  bool bVar4;
  FieldDescriptor *pFVar5;
  undefined8 extraout_RAX;
  pointer unaff_R12;
  string_view name;
  Metadata MVar6;
  int size_1;
  void *data;
  StringOutputStream raw_output;
  CodedOutputStream output;
  uint local_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  string local_b0;
  StringOutputStream local_90;
  CodedOutputStream local_80;
  
  MVar6 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  name._M_str = "optional_nested_message";
  name._M_len = 0x17;
  pFVar5 = Descriptor::FindFieldByName(MVar6.descriptor,name);
  if (pFVar5 != (FieldDescriptor *)0x0) {
    local_b8 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    io::StringOutputStream::StringOutputStream(&local_90,__return_storage_ptr__);
    local_80.impl_.is_serialization_deterministic_ =
         (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
    puVar1 = local_80.impl_.buffer_;
    local_80.impl_.had_error_ = false;
    local_80.impl_.aliasing_enabled_ = false;
    local_80.impl_.skip_check_consistency = false;
    local_80.impl_.end_ = puVar1;
    local_80.impl_.buffer_end_ = puVar1;
    local_80.impl_.stream_ = &local_90.super_ZeroCopyOutputStream;
    local_80.cur_ = puVar1;
    local_80.start_count_ = io::StringOutputStream::ByteCount(&local_90);
    bVar4 = io::StringOutputStream::Next(&local_90,(void **)&local_b0,(int *)&local_bc);
    if (bVar4 && 0 < (int)local_bc) {
      pEVar3 = (EpsCopyOutputStream *)(local_b0._M_dataplus._M_p + -0x10);
      if (local_bc < 0x11) {
        pEVar3 = (EpsCopyOutputStream *)puVar1;
      }
      local_80.impl_.end_ = pEVar3->buffer_ + ((ulong)local_bc - 0x10);
      local_80.impl_.buffer_end_ = (uint8_t *)local_b0._M_dataplus._M_p;
      local_80.cur_ = puVar1;
      if (local_bc >= 0x11) {
        local_80.impl_.buffer_end_ = (uint8_t *)0x0;
        local_80.cur_ = (uint8_t *)local_b0._M_dataplus._M_p;
      }
    }
    field_number = pFVar5->number_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,bytes,bytes + size);
    WireFormatLite::WriteBytes(field_number,&local_b0,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    io::CodedOutputStream::~CodedOutputStream(&local_80);
    return __return_storage_ptr__;
  }
  MakeInvalidEmbeddedMessage_abi_cxx11_
            ((WireFormatInvalidInputTest<proto2_unittest::TestAllTypes> *)&local_80);
  if (local_b0._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  io::CodedOutputStream::~CodedOutputStream(&local_80);
  plVar2 = (long *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar2 != local_b8) {
    operator_delete(plVar2,*(long *)local_b8 + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::string MakeInvalidEmbeddedMessage(const char* bytes, int size) {
    const FieldDescriptor* field =
        TestAllTypes::descriptor()->FindFieldByName("optional_nested_message");
    ABSL_CHECK(field != nullptr);

    std::string result;

    {
      io::StringOutputStream raw_output(&result);
      io::CodedOutputStream output(&raw_output);

      WireFormatLite::WriteBytes(field->number(), std::string(bytes, size),
                                 &output);
    }

    return result;
  }